

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void ZopfliAllocHash(size_t window_size,ZopfliHash *h)

{
  size_t __size;
  int *piVar1;
  unsigned_short *puVar2;
  
  piVar1 = (int *)malloc(0x40000);
  h->head = piVar1;
  __size = window_size * 2;
  puVar2 = (unsigned_short *)malloc(__size);
  h->prev = puVar2;
  piVar1 = (int *)malloc(window_size << 2);
  h->hashval = piVar1;
  puVar2 = (unsigned_short *)malloc(__size);
  h->same = puVar2;
  piVar1 = (int *)malloc(0x40000);
  h->head2 = piVar1;
  puVar2 = (unsigned_short *)malloc(__size);
  h->prev2 = puVar2;
  piVar1 = (int *)malloc(window_size << 2);
  h->hashval2 = piVar1;
  return;
}

Assistant:

void ZopfliAllocHash(size_t window_size, ZopfliHash* h) {
  h->head = (int*)malloc(sizeof(*h->head) * 65536);
  h->prev = (unsigned short*)malloc(sizeof(*h->prev) * window_size);
  h->hashval = (int*)malloc(sizeof(*h->hashval) * window_size);

#ifdef ZOPFLI_HASH_SAME
  h->same = (unsigned short*)malloc(sizeof(*h->same) * window_size);
#endif

#ifdef ZOPFLI_HASH_SAME_HASH
  h->head2 = (int*)malloc(sizeof(*h->head2) * 65536);
  h->prev2 = (unsigned short*)malloc(sizeof(*h->prev2) * window_size);
  h->hashval2 = (int*)malloc(sizeof(*h->hashval2) * window_size);
#endif
}